

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *centre,float radius,int a_min_of_12,int a_max_of_12)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int i;
  int iVar7;
  int iVar8;
  long lVar9;
  int a;
  float fVar10;
  float fVar11;
  
  if (PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx == '\0') {
    PathArcToFast();
  }
  if (PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx_builds == '\0') {
    lVar9 = 0;
    do {
      fVar10 = (float)(int)lVar9 / 12.0;
      fVar10 = (fVar10 + fVar10) * 3.1415927;
      fVar11 = cosf(fVar10);
      PathArcToFast::circle_vtx[lVar9].x = fVar11;
      fVar10 = sinf(fVar10);
      PathArcToFast::circle_vtx[lVar9].y = fVar10;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0xc);
    PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx_builds = '\x01';
  }
  iVar7 = (this->_Path).Size;
  if (radius == 0.0 || a_max_of_12 < a_min_of_12) {
    if (iVar7 == (this->_Path).Capacity) {
      if (iVar7 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar7 / 2 + iVar7;
      }
      iVar8 = iVar7 + 1;
      if (iVar7 + 1 < iVar6) {
        iVar8 = iVar6;
      }
      pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
      pIVar4 = (this->_Path).Data;
      if (pIVar4 == (ImVec2 *)0x0) {
        pIVar4 = (ImVec2 *)0x0;
      }
      else {
        memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
        pIVar4 = (this->_Path).Data;
      }
      ImGui::MemFree(pIVar4);
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = iVar8;
      iVar7 = (this->_Path).Size;
    }
    else {
      pIVar5 = (this->_Path).Data;
    }
    (this->_Path).Size = iVar7 + 1;
    pIVar5[iVar7] = *centre;
  }
  else {
    iVar7 = (a_max_of_12 - a_min_of_12) + iVar7 + 1;
    if ((this->_Path).Capacity < iVar7) {
      pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
      pIVar5 = (this->_Path).Data;
      if (pIVar5 == (ImVec2 *)0x0) {
        pIVar5 = (ImVec2 *)0x0;
      }
      else {
        memcpy(pIVar4,pIVar5,(long)(this->_Path).Size << 3);
        pIVar5 = (this->_Path).Data;
      }
      ImGui::MemFree(pIVar5);
      (this->_Path).Data = pIVar4;
      (this->_Path).Capacity = iVar7;
    }
    do {
      IVar1 = *centre;
      IVar2 = PathArcToFast::circle_vtx
              [(int)(a_min_of_12 +
                    (((uint)(a_min_of_12 / 6 + (a_min_of_12 >> 0x1f)) >> 1) - (a_min_of_12 >> 0x1f))
                    * -0xc)];
      iVar7 = (this->_Path).Size;
      if (iVar7 == (this->_Path).Capacity) {
        if (iVar7 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar7 / 2 + iVar7;
        }
        iVar8 = iVar7 + 1;
        if (iVar7 + 1 < iVar6) {
          iVar8 = iVar6;
        }
        pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
        pIVar4 = (this->_Path).Data;
        if (pIVar4 == (ImVec2 *)0x0) {
          pIVar4 = (ImVec2 *)0x0;
        }
        else {
          memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
          pIVar4 = (this->_Path).Data;
        }
        ImGui::MemFree(pIVar4);
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar8;
        iVar7 = (this->_Path).Size;
      }
      else {
        pIVar5 = (this->_Path).Data;
      }
      (this->_Path).Size = iVar7 + 1;
      IVar3.y = IVar2.y * radius + IVar1.y;
      IVar3.x = IVar2.x * radius + IVar1.x;
      pIVar5[iVar7] = IVar3;
      a_min_of_12 = a_min_of_12 + 1;
    } while (a_max_of_12 + 1 != a_min_of_12);
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& centre, float radius, int a_min_of_12, int a_max_of_12)
{
    static ImVec2 circle_vtx[12];
    static bool circle_vtx_builds = false;
    const int circle_vtx_count = IM_ARRAYSIZE(circle_vtx);
    if (!circle_vtx_builds)
    {
        for (int i = 0; i < circle_vtx_count; i++)
        {
            const float a = ((float)i / (float)circle_vtx_count) * 2*IM_PI;
            circle_vtx[i].x = cosf(a);
            circle_vtx[i].y = sinf(a);
        }
        circle_vtx_builds = true;
    }

    if (radius == 0.0f || a_min_of_12 > a_max_of_12)
    {
        _Path.push_back(centre);
        return;
    }
    _Path.reserve(_Path.Size + (a_max_of_12 - a_min_of_12 + 1));
    for (int a = a_min_of_12; a <= a_max_of_12; a++)
    {
        const ImVec2& c = circle_vtx[a % circle_vtx_count];
        _Path.push_back(ImVec2(centre.x + c.x * radius, centre.y + c.y * radius));
    }
}